

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,AssertionResult *assertion_result,
          char *expression_text,char *actual_predicate_value,char *expected_predicate_value)

{
  Message *pMVar1;
  char *pcVar2;
  AssertionResult *local_48;
  char *expression_text_local;
  char *actual_predicate_value_local;
  char *expected_predicate_value_local;
  char *actual_message;
  
  if (*(undefined8 **)(this + 8) == (undefined8 *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = (char *)**(undefined8 **)(this + 8);
  }
  local_48 = assertion_result;
  expression_text_local = expression_text;
  actual_predicate_value_local = actual_predicate_value;
  expected_predicate_value_local = pcVar2;
  Message::Message((Message *)&actual_message);
  std::operator<<((ostream *)(actual_message + 0x10),"Value of: ");
  pMVar1 = Message::operator<<((Message *)&actual_message,(char **)&local_48);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [12])0x16e6d3);
  Message::operator<<(pMVar1,&expression_text_local);
  if (*pcVar2 != '\0') {
    std::operator<<((ostream *)(actual_message + 0x10)," (");
    pMVar1 = Message::operator<<((Message *)&actual_message,&expected_predicate_value_local);
    Message::operator<<(pMVar1,(char (*) [2])0x16e3d9);
  }
  std::operator<<((ostream *)(actual_message + 0x10),"\nExpected: ");
  Message::operator<<((Message *)&actual_message,&actual_predicate_value_local);
  StringStreamToString(__return_storage_ptr__,(stringstream *)actual_message);
  if (actual_message != (char *)0x0) {
    (**(code **)(*(long *)actual_message + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetBoolAssertionFailureMessage(
    const AssertionResult& assertion_result,
    const char* expression_text,
    const char* actual_predicate_value,
    const char* expected_predicate_value) {
  const char* actual_message = assertion_result.message();
  Message msg;
  msg << "Value of: " << expression_text
      << "\n  Actual: " << actual_predicate_value;
  if (actual_message[0] != '\0')
    msg << " (" << actual_message << ")";
  msg << "\nExpected: " << expected_predicate_value;
  return msg.GetString();
}